

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O1

ArrayPtr<const_capnp::word> __thiscall
capnp::InputStreamMessageReader::getSegment(InputStreamMessageReader *this,uint id)

{
  ulong uVar1;
  word *pwVar2;
  ssize_t sVar3;
  ArrayPtr<const_capnp::word> *pAVar4;
  word *pwVar5;
  size_t sVar6;
  ArrayPtr<const_capnp::word> AVar7;
  
  uVar1 = (this->moreSegments).size_;
  pwVar5 = (word *)0x0;
  sVar6 = 0;
  if (id <= uVar1) {
    pAVar4 = (this->moreSegments).ptr + (id - 1);
    if (id == 0) {
      pAVar4 = &this->segment0;
    }
    pwVar5 = pAVar4->ptr;
    sVar6 = pAVar4->size_;
    pwVar2 = (word *)this->readPos;
    if ((pwVar2 != (word *)0x0) && (pwVar2 < pwVar5 + sVar6)) {
      pAVar4 = (this->moreSegments).ptr;
      sVar3 = kj::InputStream::read
                        (this->inputStream,(int)pwVar2,
                         (void *)((long)pAVar4[uVar1 - 1].ptr +
                                 (pAVar4[uVar1 - 1].size_ * 8 - (long)pwVar2)),
                         (long)(pwVar5 + sVar6) - (long)pwVar2);
      this->readPos = this->readPos + sVar3;
    }
  }
  AVar7.size_ = sVar6;
  AVar7.ptr = pwVar5;
  return AVar7;
}

Assistant:

kj::ArrayPtr<const word> InputStreamMessageReader::getSegment(uint id) {
  if (id > moreSegments.size()) {
    return nullptr;
  }

  kj::ArrayPtr<const word> segment = id == 0 ? segment0 : moreSegments[id - 1];

  if (readPos != nullptr) {
    // May need to lazily read more data.
    const byte* segmentEnd = reinterpret_cast<const byte*>(segment.end());
    if (readPos < segmentEnd) {
      // Note that lazy reads only happen when we have multiple segments, so moreSegments.back() is
      // valid.
      const byte* allEnd = reinterpret_cast<const byte*>(moreSegments.back().end());
      readPos += inputStream.read(kj::arrayPtr(readPos, allEnd - readPos), segmentEnd - readPos);
    }
  }

  return segment;
}